

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zDec.c
# Opt level: O0

SRes SzDecodeLzma(Byte *props,uint propsSize,UInt64 inSize,ILookInStream *inStream,Byte *outBuffer,
                 SizeT outSize,ISzAlloc *allocMain)

{
  undefined8 *in_RCX;
  ulong in_RDX;
  Byte *in_R8;
  long in_R9;
  ELzmaStatus status;
  SizeT dicPos;
  SizeT inProcessed;
  size_t lookahead;
  void *inBuf;
  int __result__;
  SRes res;
  CLzmaDec state;
  ISzAlloc *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  ISzAlloc *in_stack_ffffffffffffff20;
  ulong uVar1;
  undefined1 local_d8 [4];
  Byte *in_stack_ffffffffffffff30;
  uint in_stack_ffffffffffffff38;
  ELzmaStatus *in_stack_ffffffffffffff40;
  ELzmaFinishMode in_stack_ffffffffffffff4c;
  SizeT *srcLen;
  SizeT in_stack_ffffffffffffff60;
  CLzmaDec *in_stack_ffffffffffffff68;
  long local_90;
  ulong local_20;
  SRes local_4;
  
  srcLen = (SizeT *)0x0;
  uVar1 = _local_d8 >> 0x20;
  local_4 = LzmaDec_AllocateProbs
                      ((CLzmaDec *)(ulong)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                       (uint)uVar1,in_stack_ffffffffffffff20);
  if (local_4 == 0) {
    LzmaDec_Init((CLzmaDec *)0x9ef0c8);
    local_20 = in_RDX;
    do {
      _local_d8 = 0x40000;
      if (local_20 < 0x40000) {
        _local_d8 = local_20;
      }
      local_4 = (*(code *)*in_RCX)(in_RCX,&stack0xffffffffffffff30,local_d8);
      if (local_4 != 0) break;
      uVar1 = _local_d8;
      local_4 = LzmaDec_DecodeToDic(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_R8,srcLen
                                    ,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff40);
      _local_d8 = _local_d8 - uVar1;
      local_20 = local_20 - uVar1;
      if (local_4 != 0) break;
      if (in_stack_ffffffffffffff14 == 1) {
        if ((in_R9 != local_90) || (local_20 != 0)) {
          local_4 = 1;
        }
        break;
      }
      if (((in_R9 == local_90) && (local_20 == 0)) && (in_stack_ffffffffffffff14 == 4)) break;
      if (uVar1 == 0) {
        local_4 = 1;
        break;
      }
      local_4 = (*(code *)in_RCX[1])(in_RCX,uVar1);
    } while (local_4 == 0);
    LzmaDec_FreeProbs((CLzmaDec *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                      in_stack_ffffffffffffff08);
  }
  return local_4;
}

Assistant:

static SRes SzDecodeLzma(const Byte *props, unsigned propsSize, UInt64 inSize, ILookInStream *inStream,
    Byte *outBuffer, SizeT outSize, ISzAlloc *allocMain)
{
  CLzmaDec state;
  SRes res = SZ_OK;

  LzmaDec_Construct(&state);
  RINOK(LzmaDec_AllocateProbs(&state, props, propsSize, allocMain));
  state.dic = outBuffer;
  state.dicBufSize = outSize;
  LzmaDec_Init(&state);

  for (;;)
  {
    const void *inBuf = NULL;
    size_t lookahead = (1 << 18);
    if (lookahead > inSize)
      lookahead = (size_t)inSize;
    res = inStream->Look(inStream, &inBuf, &lookahead);
    if (res != SZ_OK)
      break;

    {
      SizeT inProcessed = (SizeT)lookahead, dicPos = state.dicPos;
      ELzmaStatus status;
      res = LzmaDec_DecodeToDic(&state, outSize, inBuf, &inProcessed, LZMA_FINISH_END, &status);
      lookahead -= inProcessed;
      inSize -= inProcessed;
      if (res != SZ_OK)
        break;

      if (status == LZMA_STATUS_FINISHED_WITH_MARK)
      {
        if (outSize != state.dicPos || inSize != 0)
          res = SZ_ERROR_DATA;
        break;
      }

      if (outSize == state.dicPos && inSize == 0 && status == LZMA_STATUS_MAYBE_FINISHED_WITHOUT_MARK)
        break;

      if (inProcessed == 0 && dicPos == state.dicPos)
      {
        res = SZ_ERROR_DATA;
        break;
      }

      res = inStream->Skip((void *)inStream, inProcessed);
      if (res != SZ_OK)
        break;
    }
  }

  LzmaDec_FreeProbs(&state, allocMain);
  return res;
}